

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::LoadConfig(cmCTestLaunch *this)

{
  pointer pcVar1;
  bool bVar2;
  string *path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fname;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  undefined1 local_17b8 [32];
  string local_1798;
  undefined1 local_1778 [2048];
  cmake local_f78;
  cmGlobalGenerator local_700;
  
  cmake::cmake(&local_f78,RoleScript,CTest,Normal);
  pcVar1 = local_1778 + 0x10;
  local_1778._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1778,"");
  cmake::SetHomeDirectory(&local_f78,(string *)local_1778);
  if ((pointer)local_1778._0_8_ != pcVar1) {
    operator_delete((void *)local_1778._0_8_,local_1778._16_8_ + 1);
  }
  local_1778._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1778,"");
  cmake::SetHomeOutputDirectory(&local_f78,(string *)local_1778);
  if ((pointer)local_1778._0_8_ != pcVar1) {
    operator_delete((void *)local_1778._0_8_,local_1778._16_8_ + 1);
  }
  local_1778._16_8_ = local_f78.CurrentSnapshot.Position.Position;
  local_1778._0_8_ = local_f78.CurrentSnapshot.State;
  local_1778._8_8_ = local_f78.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1778);
  cmGlobalGenerator::cmGlobalGenerator(&local_700,&local_f78);
  local_17b8._16_8_ = local_f78.CurrentSnapshot.Position.Position;
  local_17b8._0_8_ = local_f78.CurrentSnapshot.State;
  local_17b8._8_8_ = local_f78.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_1778,&local_700,(cmStateSnapshot *)local_17b8);
  local_17b8._8_8_ = (this->Reporter).LogDir._M_dataplus._M_p;
  local_17b8._0_8_ = (this->Reporter).LogDir._M_string_length;
  local_17b8._16_8_ = 0x17;
  local_17b8._24_8_ = (long)"/CTestLaunchConfig.cmake" + 1;
  views._M_len = 2;
  views._M_array = (iterator)local_17b8;
  cmCatViews_abi_cxx11_(&local_1798,views);
  bVar2 = cmsys::SystemTools::FileExists(&local_1798);
  if (bVar2) {
    bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_1778,&local_1798);
    if (bVar2) {
      local_17b8._0_8_ = (cmState *)(local_17b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_17b8,"CTEST_SOURCE_DIRECTORY","");
      cmMakefile::GetSafeDefinition((cmMakefile *)local_1778,(string *)local_17b8);
      path = &(this->Reporter).SourceDir;
      std::__cxx11::string::_M_assign((string *)path);
      if ((cmState *)local_17b8._0_8_ != (cmState *)(local_17b8 + 0x10)) {
        operator_delete((void *)local_17b8._0_8_,local_17b8._16_8_ + 1);
      }
      cmsys::SystemTools::ConvertToUnixSlashes(path);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1798._M_dataplus._M_p != &local_1798.field_2) {
    operator_delete(local_1798._M_dataplus._M_p,local_1798.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::~cmMakefile((cmMakefile *)local_1778);
  cmGlobalGenerator::~cmGlobalGenerator(&local_700);
  cmake::~cmake(&local_f78);
  return;
}

Assistant:

void cmCTestLaunch::LoadConfig()
{
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  std::string fname =
    cmStrCat(this->Reporter.LogDir, "CTestLaunchConfig.cmake");
  if (cmSystemTools::FileExists(fname) && mf.ReadListFile(fname)) {
    this->Reporter.SourceDir = mf.GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
    cmSystemTools::ConvertToUnixSlashes(this->Reporter.SourceDir);
  }
}